

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GLES2ThreadTest::MakeCurrent::MakeCurrent
          (MakeCurrent *this,EGLThread *thread,EGLDisplay display,
          SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *surface,
          SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *context)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  GLES2Context *pGVar3;
  Surface *pSVar4;
  SharedPtr<tcu::ThreadUtil::Object> local_68;
  SharedPtr<tcu::ThreadUtil::Object> local_58;
  SharedPtr<tcu::ThreadUtil::Object> local_48;
  SharedPtr<tcu::ThreadUtil::Object> local_38;
  
  tcu::ThreadUtil::Operation::Operation(&this->super_Operation,"MakeCurrent");
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__MakeCurrent_0215ed08;
  this->m_display = display;
  (this->m_surface).m_ptr = surface->m_ptr;
  pSVar2 = surface->m_state;
  (this->m_surface).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_surface).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  (this->m_context).m_ptr = context->m_ptr;
  pSVar2 = context->m_state;
  (this->m_context).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_context).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  pGVar3 = (this->m_context).m_ptr;
  if (pGVar3 != (GLES2Context *)0x0) {
    local_38.m_state = (this->m_context).m_state;
    if (local_38.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_38.m_state)->strongRefCount = (local_38.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_38.m_state)->weakRefCount = (local_38.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_38.m_ptr = &pGVar3->super_Object;
    tcu::ThreadUtil::Operation::modifyObject(&this->super_Operation,&local_38);
    if (local_38.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_38.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_38.m_ptr = (Object *)0x0;
        (*(local_38.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_38.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_38.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_38.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_38.m_state = (SharedPtrStateBase *)0x0;
      }
    }
  }
  pSVar4 = (this->m_surface).m_ptr;
  if (pSVar4 != (Surface *)0x0) {
    local_48.m_state = (this->m_surface).m_state;
    if (local_48.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_48.m_state)->strongRefCount = (local_48.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_48.m_state)->weakRefCount = (local_48.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_48.m_ptr = &pSVar4->super_Object;
    tcu::ThreadUtil::Operation::modifyObject(&this->super_Operation,&local_48);
    if (local_48.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_48.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_48.m_ptr = (Object *)0x0;
        (*(local_48.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_48.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_48.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_48.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_48.m_state = (SharedPtrStateBase *)0x0;
      }
    }
  }
  pGVar3 = (thread->context).m_ptr;
  if (pGVar3 != (GLES2Context *)0x0) {
    local_58.m_state = (thread->context).m_state;
    if (local_58.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_58.m_state)->strongRefCount = (local_58.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_58.m_state)->weakRefCount = (local_58.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_58.m_ptr = &pGVar3->super_Object;
    tcu::ThreadUtil::Operation::modifyObject(&this->super_Operation,&local_58);
    if (local_58.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_58.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_58.m_ptr = (Object *)0x0;
        (*(local_58.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_58.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_58.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_58.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_58.m_state = (SharedPtrStateBase *)0x0;
      }
    }
  }
  pSVar4 = (thread->surface).m_ptr;
  if (pSVar4 != (Surface *)0x0) {
    local_68.m_state = (thread->surface).m_state;
    if (local_68.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_68.m_state)->strongRefCount = (local_68.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_68.m_state)->weakRefCount = (local_68.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_68.m_ptr = &pSVar4->super_Object;
    tcu::ThreadUtil::Operation::modifyObject(&this->super_Operation,&local_68);
    if (local_68.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_68.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_68.m_ptr = (Object *)0x0;
        (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_68.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_68.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_68.m_state = (SharedPtrStateBase *)0x0;
      }
    }
  }
  pSVar2 = (thread->context).m_state;
  if (pSVar2 != (this->m_context).m_state) {
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar2->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (thread->context).m_ptr = (GLES2Context *)0x0;
        (*((thread->context).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((thread->context).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar2 = (thread->context).m_state;
        if (pSVar2 != (SharedPtrStateBase *)0x0) {
          (*pSVar2->_vptr_SharedPtrStateBase[1])();
        }
        (thread->context).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (thread->context).m_ptr = (this->m_context).m_ptr;
    pSVar2 = (this->m_context).m_state;
    (thread->context).m_state = pSVar2;
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((thread->context).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  pSVar2 = (thread->surface).m_state;
  if (pSVar2 != (this->m_surface).m_state) {
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar2->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (thread->surface).m_ptr = (Surface *)0x0;
        (*((thread->surface).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((thread->surface).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar2 = (thread->surface).m_state;
        if (pSVar2 != (SharedPtrStateBase *)0x0) {
          (*pSVar2->_vptr_SharedPtrStateBase[1])();
        }
        (thread->surface).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (thread->surface).m_ptr = (this->m_surface).m_ptr;
    pSVar2 = (this->m_surface).m_state;
    (thread->surface).m_state = pSVar2;
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((thread->surface).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  return;
}

Assistant:

MakeCurrent::MakeCurrent (EGLThread& thread, EGLDisplay display, SharedPtr<Surface> surface, SharedPtr<GLES2Context> context)
	: tcu::ThreadUtil::Operation	("MakeCurrent")
	, m_display					(display)
	, m_surface					(surface)
	, m_context					(context)
{
	if (m_context)
		modifyObject(SharedPtr<tcu::ThreadUtil::Object>(m_context));

	if (m_surface)
		modifyObject(SharedPtr<tcu::ThreadUtil::Object>(m_surface));

	// Release old contexts
	if (thread.context)
	{
		modifyObject(SharedPtr<tcu::ThreadUtil::Object>(thread.context));
	}

	// Release old surface
	if (thread.surface)
	{
		modifyObject(SharedPtr<tcu::ThreadUtil::Object>(thread.surface));
	}

	thread.context	= m_context;
	thread.surface	= m_surface;
}